

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_test.pb.cc
# Opt level: O0

uint8_t * __thiscall
proto2_unittest::TestAny::_InternalSerialize
          (TestAny *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  Any *value;
  TestAny *pTVar1;
  bool bVar2;
  int32_t iVar3;
  int iVar4;
  uint uVar5;
  uint32_t *puVar6;
  RepeatedPtrField<google::protobuf::Any> *this_00;
  const_reference this_01;
  ulong uVar7;
  WireFormatLite *this_02;
  UnknownFieldSet *unknown_fields;
  char *in_R9;
  string_view sVar8;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  string *local_48;
  string *_s;
  Any *repfield;
  uint local_30;
  uint n;
  uint i;
  uint32_t cached_has_bits;
  TestAny *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  TestAny *this_local;
  
  n = 0;
  _i = this;
  this_ = (TestAny *)stream;
  stream_local = (EpsCopyOutputStream *)target;
  target_local = (uint8_t *)this;
  puVar6 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  if (((*puVar6 & 4) != 0) && (iVar3 = _internal_int32_value(_i), pTVar1 = this_, iVar3 != 0)) {
    iVar3 = _internal_int32_value(_i);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>
                             ((EpsCopyOutputStream *)pTVar1,iVar3,(uint8_t *)stream_local);
  }
  puVar6 = google::protobuf::internal::HasBits<1>::operator[](&(_i->field_0)._impl_._has_bits_,0);
  n = *puVar6;
  if ((n & 2) != 0) {
    value = (_i->field_0)._impl_.any_value_;
    iVar4 = google::protobuf::Any::GetCachedSize((_i->field_0)._impl_.any_value_);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (2,(MessageLite *)value,iVar4,(uint8_t *)stream_local,
                              (EpsCopyOutputStream *)this_);
  }
  local_30 = 0;
  repfield._4_4_ = _internal_repeated_any_value_size(_i);
  for (; local_30 < repfield._4_4_; local_30 = local_30 + 1) {
    this_00 = _internal_repeated_any_value(_i);
    this_01 = google::protobuf::RepeatedPtrField<google::protobuf::Any>::Get(this_00,local_30);
    _s = (string *)this_01;
    iVar4 = google::protobuf::Any::GetCachedSize(this_01);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (3,(MessageLite *)this_01,iVar4,(uint8_t *)stream_local,
                              (EpsCopyOutputStream *)this_);
  }
  if ((n & 1) != 0) {
    _internal_text_abi_cxx11_(_i);
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      local_48 = _internal_text_abi_cxx11_(_i);
      this_02 = (WireFormatLite *)std::__cxx11::string::data();
      uVar5 = std::__cxx11::string::length();
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_58,"proto2_unittest.TestAny.text");
      sVar8._M_str = in_R9;
      sVar8._M_len = (size_t)local_58._M_str;
      google::protobuf::internal::WireFormatLite::VerifyUtf8String
                (this_02,(char *)(ulong)uVar5,1,(Operation)local_58._M_len,sVar8);
      pTVar1 = this_;
      sVar8 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_48);
      stream_local = (EpsCopyOutputStream *)
                     google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                               ((EpsCopyOutputStream *)pTVar1,4,sVar8,(uint8_t *)stream_local);
    }
  }
  bVar2 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(_i->super_Message).super_MessageLite._internal_metadata_);
  if (bVar2) {
    unknown_fields =
         google::protobuf::internal::InternalMetadata::
         unknown_fields<google::protobuf::UnknownFieldSet>
                   (&(_i->super_Message).super_MessageLite._internal_metadata_,
                    google::protobuf::UnknownFieldSet::default_instance);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                             (unknown_fields,(uint8_t *)stream_local,(EpsCopyOutputStream *)this_);
  }
  return (uint8_t *)stream_local;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestAny::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestAny& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto2_unittest.TestAny)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  // int32 int32_value = 1;
  if ((this_._impl_._has_bits_[0] & 0x00000004u) != 0) {
    if (this_._internal_int32_value() != 0) {
      target =
          ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>(
              stream, this_._internal_int32_value(), target);
    }
  }

  cached_has_bits = this_._impl_._has_bits_[0];
  // .google.protobuf.Any any_value = 2;
  if ((cached_has_bits & 0x00000002u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        2, *this_._impl_.any_value_, this_._impl_.any_value_->GetCachedSize(), target,
        stream);
  }

  // repeated .google.protobuf.Any repeated_any_value = 3;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_repeated_any_value_size());
       i < n; i++) {
    const auto& repfield = this_._internal_repeated_any_value().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            3, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // string text = 4;
  if ((cached_has_bits & 0x00000001u) != 0) {
    if (!this_._internal_text().empty()) {
      const ::std::string& _s = this_._internal_text();
      ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
          _s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormatLite::SERIALIZE, "proto2_unittest.TestAny.text");
      target = stream->WriteStringMaybeAliased(4, _s, target);
    }
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto2_unittest.TestAny)
  return target;
}